

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O0

monotoneVectorsStruct * allocPointersToMonotoneVectors(void)

{
  monotoneVectorsStruct *pmVar1;
  monotoneVectorsStruct *newPointersToMonotoneVectors;
  
  pmVar1 = (monotoneVectorsStruct *)malloc(0x18);
  pmVar1->attrKnownMonotone = (Vec_Int_t *)0x0;
  pmVar1->attrCandMonotone = (Vec_Int_t *)0x0;
  pmVar1->attrHintMonotone = (Vec_Int_t *)0x0;
  if (pmVar1 != (monotoneVectorsStruct *)0x0) {
    return pmVar1;
  }
  __assert_fail("newPointersToMonotoneVectors != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/monotone.c"
                ,0x50,"struct monotoneVectorsStruct *allocPointersToMonotoneVectors()");
}

Assistant:

struct monotoneVectorsStruct *allocPointersToMonotoneVectors()
{
	struct monotoneVectorsStruct *newPointersToMonotoneVectors;

	newPointersToMonotoneVectors = (struct monotoneVectorsStruct *)malloc(sizeof (struct monotoneVectorsStruct));

	newPointersToMonotoneVectors->attrKnownMonotone = NULL;
	newPointersToMonotoneVectors->attrCandMonotone = NULL;
	newPointersToMonotoneVectors->attrHintMonotone = NULL;
		
	assert( newPointersToMonotoneVectors != NULL );
	return newPointersToMonotoneVectors;
}